

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void anon_unknown.dwarf_334836::fillHeader(Header *header,char *sender,char *target,int seq)

{
  allocator<char> local_91;
  STRING local_90;
  FieldBase local_70;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,sender,&local_91);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_70,&local_90);
  FIX::FieldMap::setField(&header->super_FieldMap,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,target,&local_91);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_70,&local_90);
  FIX::FieldMap::setField(&header->super_FieldMap,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  FIX::UtcTimeStamp::now();
  FIX::SendingTime::SendingTime((SendingTime *)&local_70,(UTCTIMESTAMP *)&local_90);
  FIX::FieldMap::setField(&header->super_FieldMap,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::MsgSeqNum::MsgSeqNum((MsgSeqNum *)&local_70,(long)seq);
  FIX::FieldMap::setField(&header->super_FieldMap,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  return;
}

Assistant:

void fillHeader(FIX::Header &header, const char *sender, const char *target, int seq) {
  header.setField(SenderCompID(sender));
  header.setField(TargetCompID(target));
  header.setField(SendingTime(UtcTimeStamp::now()));
  header.setField(MsgSeqNum(seq));
}